

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraph.cpp
# Opt level: O0

void __thiscall ControlFlowGraph::printWithRegions(ControlFlowGraph *this,ostream *ostream)

{
  ostream *in_RSI;
  ostream *in_stack_00000028;
  GraphBuilder *in_stack_00000030;
  
  std::operator<<(in_RSI,"digraph \"Control Flow Graph\" {\n");
  std::operator<<(in_RSI,"compound = true\n");
  std::unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>::operator->
            ((unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_> *)
             0x1b3336);
  ThreadRegionsBuilder::printNodes((ThreadRegionsBuilder *)this,ostream);
  std::unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_>::operator->
            ((unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_> *)0x1b334c);
  GraphBuilder::printEdges(in_stack_00000030,in_stack_00000028);
  std::unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>::operator->
            ((unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_> *)
             0x1b3366);
  ThreadRegionsBuilder::printEdges((ThreadRegionsBuilder *)this,ostream);
  std::operator<<(in_RSI,"}\n");
  return;
}

Assistant:

void ControlFlowGraph::printWithRegions(std::ostream &ostream) const {
    ostream << "digraph \"Control Flow Graph\" {\n";
    ostream << "compound = true\n";

    threadRegionsBuilder->printNodes(ostream);
    graphBuilder->printEdges(ostream);
    threadRegionsBuilder->printEdges(ostream);

    ostream << "}\n";
}